

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

bool __thiscall S1Interval::FastContains(S1Interval *this,double p)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  
  dVar1 = (this->bounds_).c_[0];
  dVar2 = (this->bounds_).c_[1];
  if (dVar1 <= dVar2) {
    if (dVar1 <= p) {
      bVar3 = p <= dVar2;
      goto LAB_001e47aa;
    }
  }
  else if ((dVar1 <= p) || (p <= dVar2)) {
    bVar3 = -(dVar1 != 3.141592653589793) | -(dVar2 != -3.141592653589793);
    goto LAB_001e47aa;
  }
  bVar3 = 0;
LAB_001e47aa:
  return (bool)(bVar3 & 1);
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }